

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::ProcessSecondChanceBoundary(LinearScan *this,BranchInstr *branchInstr)

{
  RegNum RVar1;
  Kind KVar2;
  long *plVar3;
  long lVar4;
  Type pBVar5;
  code *pcVar6;
  bool bVar7;
  BOOLEAN BVar8;
  BOOL BVar9;
  uint uVar10;
  undefined4 *puVar11;
  Type *ppLVar12;
  Type pLVar13;
  MultiBranchInstr *pMVar14;
  BVSparseNode *pBVar15;
  long lVar16;
  long *plVar17;
  LabelInstr *pLVar18;
  BVSparseNode *pBVar19;
  ulong uVar20;
  BranchDictionary *branchDictionary;
  int iVar21;
  BVSparse<Memory::JitArenaAllocator> local_68;
  long *local_48;
  LinearScan *local_40;
  BranchInstr *local_38;
  
  BVar9 = Func::HasTry(this->func);
  if ((BVar9 == 0) || (bVar7 = Func::DoOptimizeTry(this->func), bVar7)) {
    if ((this->currentOpHelperBlock != (OpHelperBlock *)0x0) &&
       ((BranchInstr *)this->currentOpHelperBlock->opHelperEndInstr == branchInstr)) {
      pBVar19 = (BVSparseNode *)this->opHelperSpilledLiveranges;
      local_68.head = pBVar19;
      local_68.lastFoundIndex = pBVar19;
      local_38 = branchInstr;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      while( true ) {
        if (pBVar19 == (BVSparseNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) goto LAB_0057e5f9;
          *puVar11 = 0;
          pBVar19 = local_68.lastFoundIndex;
        }
        branchInstr = local_38;
        if (pBVar19->next == local_68.head) break;
        local_68.lastFoundIndex = pBVar19->next;
        ppLVar12 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&local_68);
        pLVar13 = *ppLVar12;
        pBVar19 = local_68.lastFoundIndex;
        if ((*(ushort *)&pLVar13->field_0x9c & 0x40) == 0) {
          if ((*(ushort *)&pLVar13->field_0x9c >> 9 & 1) != 0) {
            RVar1 = pLVar13->reg;
            BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
            (this->secondChanceRegs).word =
                 (this->secondChanceRegs).word | 1L << (RVar1 & (RegXMM15|RegXMM14));
            pLVar13 = *ppLVar12;
          }
          this->regContent[pLVar13->reg] = pLVar13;
          pBVar19 = local_68.lastFoundIndex;
        }
      }
    }
    pLVar18 = branchInstr->m_branchTarget;
    if (pLVar18 == (LabelInstr *)0x0) {
      local_40 = this;
      if (branchInstr->m_isMultiBranch == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
        if (!bVar7) goto LAB_0057e5f9;
        *puVar11 = 0;
      }
      pMVar14 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
      local_68.alloc = ((pMVar14->super_BranchInstr).super_Instr.m_func)->m_alloc;
      local_68.lastUsedNodePrevNextField = &local_68.head;
      local_68.head = (BVSparseNode *)0x0;
      local_68.lastFoundIndex = (Type)0x0;
      plVar3 = (long *)pMVar14->m_branchTargets;
      if (plVar3 != (long *)0x0) {
        KVar2 = pMVar14->m_kind;
        if ((KVar2 == IntJumpTable) || (KVar2 == SingleCharStrJumpTable)) {
          lVar16 = pMVar14->m_baseCaseValue;
          plVar17 = plVar3 + 1;
          if (lVar16 <= pMVar14->m_lastCaseValue) {
            lVar4 = *plVar3;
            local_48 = plVar3 + 1;
            do {
              pLVar18 = *(LabelInstr **)(lVar4 + pMVar14->m_baseCaseValue * -8 + lVar16 * 8);
              BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(&local_68,pLVar18->m_id);
              if (BVar8 == '\0') {
                BVSparse<Memory::JitArenaAllocator>::Set(&local_68,pLVar18->m_id);
                ProcessSecondChanceBoundaryHelper(local_40,branchInstr,pLVar18);
              }
              lVar16 = lVar16 + 1;
              plVar17 = local_48;
            } while (lVar16 <= pMVar14->m_lastCaseValue);
          }
        }
        else {
          if (KVar2 != StrDictionary) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x435,"(false)","false");
            goto LAB_0057e5f9;
          }
          uVar10 = *(uint *)((long)plVar3 + 0x1c);
          plVar17 = plVar3 + 7;
          if (uVar10 != 0) {
            uVar20 = 0;
            local_48 = plVar3 + 7;
            local_38 = branchInstr;
            do {
              iVar21 = *(int *)(*plVar3 + uVar20 * 4);
              if (iVar21 != -1) {
                do {
                  lVar16 = (long)iVar21;
                  iVar21 = *(int *)(plVar3[1] + 8 + lVar16 * 0x18);
                  pLVar18 = *(LabelInstr **)(plVar3[1] + lVar16 * 0x18);
                  BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(&local_68,pLVar18->m_id);
                  if (BVar8 == '\0') {
                    BVSparse<Memory::JitArenaAllocator>::Set(&local_68,pLVar18->m_id);
                    ProcessSecondChanceBoundaryHelper(local_40,local_38,pLVar18);
                  }
                } while (iVar21 != -1);
                uVar10 = *(uint *)((long)plVar3 + 0x1c);
              }
              uVar20 = uVar20 + 1;
              plVar17 = local_48;
              branchInstr = local_38;
            } while (uVar20 < uVar10);
          }
        }
        pLVar18 = (LabelInstr *)*plVar17;
        BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(&local_68,pLVar18->m_id);
        if (BVar8 == '\0') {
          BVSparse<Memory::JitArenaAllocator>::Set(&local_68,pLVar18->m_id);
          ProcessSecondChanceBoundaryHelper(local_40,branchInstr,pLVar18);
        }
      }
      this = local_40;
      if (local_68.head != (BVSparseNode *)0x0) {
        pBVar5 = local_68.head;
        pBVar19 = (local_68.alloc)->bvFreeList;
        do {
          pBVar15 = pBVar5;
          pBVar5 = pBVar15->next;
          pBVar15->next = pBVar19;
          pBVar19 = pBVar15;
        } while (pBVar5 != (Type)0x0);
        (local_68.alloc)->bvFreeList = pBVar15;
      }
    }
    else {
      if (branchInstr->m_isMultiBranch != false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
        if (!bVar7) {
LAB_0057e5f9:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar11 = 0;
        pLVar18 = branchInstr->m_branchTarget;
      }
      ProcessSecondChanceBoundaryHelper(this,branchInstr,pLVar18);
    }
    SaveRegContent(this,&branchInstr->super_Instr);
  }
  return;
}

Assistant:

void
LinearScan::ProcessSecondChanceBoundary(IR::BranchInstr *branchInstr)
{
    if (this->func->HasTry() && !this->func->DoOptimizeTry())
    {
        return;
    }

    if (this->currentOpHelperBlock && this->currentOpHelperBlock->opHelperEndInstr == branchInstr)
    {
        // Lifetimes opHelperSpilled won't get recorded by SaveRegContent().  Do it here.
        FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
        {
            if (!lifetime->cantOpHelperSpill)
            {
                if (lifetime->isSecondChanceAllocated)
                {
                    this->secondChanceRegs.Set(lifetime->reg);
                }
                this->regContent[lifetime->reg] = lifetime;
            }
        } NEXT_SLIST_ENTRY;
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->MapUniqueMultiBrLabels([=](IR::LabelInstr * branchLabel) -> void
        {
            this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
        });
    }
    else
    {
        IR::LabelInstr *branchLabel = branchInstr->GetTarget();
        this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
    }

    this->SaveRegContent(branchInstr);
}